

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_user(Curl_easy *data,connectdata *conn)

{
  char *local_40;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((data->state).aptr.user == (char *)0x0) {
    pop3_state(data,POP3_STOP);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    if (conn->user == (char *)0x0) {
      local_40 = "";
    }
    else {
      local_40 = conn->user;
    }
    data_local._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"USER %s",local_40);
    if (data_local._4_4_ == CURLE_OK) {
      pop3_state(data,POP3_USER);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_perform_user(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we do not */
  if(!data->state.aptr.user) {
    pop3_state(data, POP3_STOP);

    return result;
  }

  /* Send the USER command */
  result = Curl_pp_sendf(data, &conn->proto.pop3c.pp, "USER %s",
                         conn->user ? conn->user : "");
  if(!result)
    pop3_state(data, POP3_USER);

  return result;
}